

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerCallIDynamicSpread(Lowerer *this,Instr *callInstr,ushort callFlags)

{
  Func *this_00;
  _func_int **pp_Var1;
  Instr *this_01;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  Instr *insertBeforeInstrForCFG;
  RegOpnd *dst;
  IndirOpnd *pIVar8;
  LabelInstr *target;
  IntConstOpnd *pIVar9;
  RegOpnd *indexOpnd;
  Instr *pIVar10;
  undefined1 *puVar11;
  Lowerer *this_02;
  Lowerer *pLVar12;
  LowererMDArch *this_03;
  
  if (callInstr->m_opcode != CallIDynamicSpread) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54db,"(callInstr->m_opcode == Js::OpCode::CallIDynamicSpread)",
                       "callInstr->m_opcode == Js::OpCode::CallIDynamicSpread");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  this_00 = callInstr->m_func;
  bVar3 = Func::IsInlinee(this_00);
  if (bVar3) {
    puVar11 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar11 = 0x25;
    __cxa_throw(puVar11,&Js::RejitException::typeinfo,0);
  }
  pOVar6 = IR::Instr::UnlinkSrc2(callInstr);
  OVar4 = IR::Opnd::GetKind(pOVar6);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  pp_Var1 = pOVar6[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  if (((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  if ((~*(uint *)(pp_Var1 + 3) & 0x100001) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54e9,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  IR::Opnd::Free(pOVar6,this->m_func);
  pLVar12 = (Lowerer *)pp_Var1[5];
  if (*(OpCode *)&(pLVar12->m_lowererMD).lowererMDArch.helperCallArgsCount != ArgOut_A_SpreadArg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54ed,"(spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg)",
                       "spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  this_02 = pLVar12;
  pOVar6 = IR::Instr::UnlinkSrc1((Instr *)pLVar12);
  pRVar7 = GetRegOpnd(this_02,pOVar6,(Instr *)pLVar12,this_00,TyUint64);
  pOVar6 = IR::Instr::UnlinkSrc2((Instr *)pLVar12);
  OVar4 = IR::Opnd::GetKind(pOVar6);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  pp_Var1 = pOVar6[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  if (((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  if ((~*(uint *)(pp_Var1 + 3) & 0x100001) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54f6,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  IR::Opnd::Free(pOVar6,this->m_func);
  pIVar10 = (Instr *)pp_Var1[5];
  pOVar6 = IR::Instr::UnlinkSrc2(pIVar10);
  OVar4 = IR::Opnd::GetKind(pOVar6);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  pp_Var1 = pOVar6[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_005abcb0;
    *puVar5 = 0;
  }
  IR::Instr::Unlink(pIVar10);
  IR::Instr::FreeDst(pIVar10);
  IR::Instr::Unlink((Instr *)pLVar12);
  IR::Instr::FreeDst((Instr *)pLVar12);
  this_01 = (Instr *)pp_Var1[5];
  if (this_01->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5504,"(startCallInstr->m_opcode == Js::OpCode::StartCall)",
                       "startCallInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar3) {
LAB_005abcb0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  insertBeforeInstrForCFG = IR::Instr::GetNextRealInstr(this_01);
  IR::Instr::Remove(this_01);
  dst = IR::RegOpnd::New(TyUint32,this_00);
  pIVar8 = IR::IndirOpnd::New(pRVar7,0x20,TyUint32,this_00,false);
  InsertMove(&dst->super_Opnd,&pIVar8->super_Opnd,callInstr,true);
  target = IR::LabelInstr::New(Label,this_00,false);
  pLVar12 = (Lowerer *)0x0;
  pIVar9 = IR::IntConstOpnd::New(0,TyInt8,this_00,false);
  InsertCompareBranch(pLVar12,&dst->super_Opnd,&pIVar9->super_Opnd,BrEq_A,true,target,callInstr,
                      false);
  indexOpnd = IR::RegOpnd::New(TyUint32,this_00);
  InsertMove(&indexOpnd->super_Opnd,&dst->super_Opnd,callInstr,true);
  pIVar8 = IR::IndirOpnd::New(pRVar7,0x28,TyUint64,this_00,false);
  pRVar7 = IR::RegOpnd::New(TyUint64,this_00);
  pIVar9 = IR::IntConstOpnd::New(0x18,TyUint8,this_00,false);
  InsertAdd(false,&pRVar7->super_Opnd,&pIVar8->super_Opnd,&pIVar9->super_Opnd,callInstr);
  this_03 = &(this->m_lowererMD).lowererMDArch;
  LowererMDArch::LowerInlineSpreadArgOutLoop(this_03,callInstr,indexOpnd,pRVar7);
  IR::Instr::InsertBefore(callInstr,&target->super_Instr);
  callInstr->m_opcode = CallIDynamic;
  pIVar10 = LowererMDArch::LowerCallIDynamic
                      (this_03,callInstr,pIVar10,&dst->super_Opnd,callFlags,insertBeforeInstrForCFG)
  ;
  return pIVar10;
}

Assistant:

IR::Instr *
Lowerer::LowerCallIDynamicSpread(IR::Instr *callInstr, ushort callFlags)
{
    Assert(callInstr->m_opcode == Js::OpCode::CallIDynamicSpread);

    IR::Instr * insertBeforeInstrForCFG = nullptr;

    Func *const func = callInstr->m_func;

    if (func->IsInlinee())
    {
        throw Js::RejitException(RejitReason::InlineSpreadDisabled);
    }

    IR::Instr *spreadArrayInstr = callInstr;
    IR::SymOpnd    *argLinkOpnd = spreadArrayInstr->UnlinkSrc2()->AsSymOpnd();
    StackSym       *argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);
    spreadArrayInstr = argLinkSym->m_instrDef;

    Assert(spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg);

    IR::Opnd *arraySrcOpnd = spreadArrayInstr->UnlinkSrc1();
    IR::RegOpnd *arrayOpnd = GetRegOpnd(arraySrcOpnd, spreadArrayInstr, func, TyMachPtr);

    argLinkOpnd = spreadArrayInstr->UnlinkSrc2()->AsSymOpnd();

    // Walk the arg chain and find the start call
    argLinkSym = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);

    // Nothing to be done for the function object, emit as normal
    IR::Instr *thisInstr = argLinkSym->m_instrDef;
    IR::RegOpnd *thisOpnd = thisInstr->UnlinkSrc2()->AsRegOpnd();
    argLinkSym = thisOpnd->m_sym->AsStackSym();
    thisInstr->Unlink();
    thisInstr->FreeDst();

    // Remove the array ArgOut instr and StartCall, they are no longer needed
    spreadArrayInstr->Unlink();
    spreadArrayInstr->FreeDst();
    IR::Instr *startCallInstr = argLinkSym->m_instrDef;
    Assert(startCallInstr->m_opcode == Js::OpCode::StartCall);
    insertBeforeInstrForCFG = startCallInstr->GetNextRealInstr();
    startCallInstr->Remove();

    IR::RegOpnd *argsLengthOpnd = IR::RegOpnd::New(TyUint32, func);
    IR::IndirOpnd *arrayLengthPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfLength(), TyUint32, func);
    Lowerer::InsertMove(argsLengthOpnd, arrayLengthPtrOpnd, callInstr);

    // Don't bother expanding args if there are zero
    IR::LabelInstr *zeroArgsLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertCompareBranch(argsLengthOpnd, IR::IntConstOpnd::New(0, TyInt8, func), Js::OpCode::BrEq_A, true, zeroArgsLabel, callInstr);

    IR::RegOpnd *indexOpnd = IR::RegOpnd::New(TyUint32, func);
    Lowerer::InsertMove(indexOpnd, argsLengthOpnd, callInstr);

    // Get the array head offset and length
    IR::IndirOpnd *arrayHeadPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfHead(), TyMachPtr, func);
    IR::RegOpnd *arrayElementsStartOpnd = IR::RegOpnd::New(TyMachPtr, func);
    InsertAdd(false, arrayElementsStartOpnd, arrayHeadPtrOpnd, IR::IntConstOpnd::New(offsetof(Js::SparseArraySegment<Js::Var>, elements), TyUint8, func), callInstr);

    this->m_lowererMD.LowerInlineSpreadArgOutLoop(callInstr, indexOpnd, arrayElementsStartOpnd);

    // Resume if we have zero args
    callInstr->InsertBefore(zeroArgsLabel);

    // Lower call
    callInstr->m_opcode = Js::OpCode::CallIDynamic;
    callInstr = m_lowererMD.LowerCallIDynamic(callInstr, thisInstr, argsLengthOpnd, callFlags, insertBeforeInstrForCFG);

    return callInstr;
}